

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

size_t __thiscall ImgfsFile::DirEntry::calc_compressed_size(DirEntry *this,ImgfsFile *imgfs)

{
  anon_class_16_2_e558d909 fn;
  size_t local_28;
  size_t fulltotal;
  size_t comptotal;
  ImgfsFile *imgfs_local;
  DirEntry *this_local;
  
  fulltotal = 0;
  local_28 = 0;
  fn.fulltotal = &local_28;
  fn.comptotal = &fulltotal;
  comptotal = (size_t)imgfs;
  imgfs_local = (ImgfsFile *)this;
  datatable_enumerator<ImgfsFile::DirEntry::calc_compressed_size(ImgfsFile&)::_lambda(unsigned_long,unsigned_long,unsigned_long)_1_>
            (this,imgfs,fn);
  if (local_28 != this->_size) {
    printf("WARNING: stored size=%d, calculated size: %d\n",(ulong)this->_size,local_28 & 0xffffffff
          );
  }
  return fulltotal;
}

Assistant:

size_t calc_compressed_size(ImgfsFile& imgfs)
        {
            size_t comptotal= 0;
            size_t fulltotal= 0;
            datatable_enumerator(imgfs, [&comptotal, &fulltotal](uint64_t ofs, size_t compsize, size_t fullsize) {
                    comptotal+=compsize;
                    fulltotal+=fullsize;
                }
            );
            if (fulltotal!=_size)
                printf("WARNING: stored size=%d, calculated size: %d\n", _size, int(fulltotal));

            return comptotal;

        }